

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_word.c
# Opt level: O0

int BN_sub_word(BIGNUM *a,ulong w)

{
  int iVar1;
  int i;
  int local_1c;
  ulong local_18;
  int local_4;
  
  if (w == 0) {
    local_4 = 1;
  }
  else {
    iVar1 = BN_is_zero((BIGNUM *)a);
    if (iVar1 == 0) {
      if (a->neg == 0) {
        if ((a->top == 1) && (*a->d < w)) {
          *a->d = w - *a->d;
          a->neg = 1;
          local_4 = 1;
        }
        else {
          local_18 = w;
          for (local_1c = 0; a->d[local_1c] < local_18; local_1c = local_1c + 1) {
            a->d[local_1c] = a->d[local_1c] - local_18;
            local_18 = 1;
          }
          a->d[local_1c] = a->d[local_1c] - local_18;
          if ((a->d[local_1c] == 0) && (local_1c == a->top + -1)) {
            a->top = a->top + -1;
          }
          local_4 = 1;
        }
      }
      else {
        a->neg = 0;
        local_4 = BN_add_word(a,w);
        a->neg = 1;
      }
    }
    else {
      local_4 = BN_set_word(a,w);
      if (local_4 != 0) {
        BN_set_negative(a,1);
      }
    }
  }
  return local_4;
}

Assistant:

int BN_sub_word(BIGNUM *a, BN_ULONG w)
{
    int i;

    bn_check_top(a);
    w &= BN_MASK2;

    /* degenerate case: w is zero */
    if (!w)
        return 1;
    /* degenerate case: a is zero */
    if (BN_is_zero(a)) {
        i = BN_set_word(a, w);
        if (i != 0)
            BN_set_negative(a, 1);
        return i;
    }
    /* handle 'a' when negative */
    if (a->neg) {
        a->neg = 0;
        i = BN_add_word(a, w);
        a->neg = 1;
        return i;
    }

    if ((a->top == 1) && (a->d[0] < w)) {
        a->d[0] = w - a->d[0];
        a->neg = 1;
        return 1;
    }
    i = 0;
    for (;;) {
        if (a->d[i] >= w) {
            a->d[i] -= w;
            break;
        } else {
            a->d[i] = (a->d[i] - w) & BN_MASK2;
            i++;
            w = 1;
        }
    }
    if ((a->d[i] == 0) && (i == (a->top - 1)))
        a->top--;
    bn_check_top(a);
    return 1;
}